

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.h
# Opt level: O3

Float __thiscall pbrt::RGBSigmoidPolynomial::MaxValue(RGBSigmoidPolynomial *this)

{
  float fVar1;
  Float FVar2;
  Float FVar3;
  undefined8 uVar4;
  float fVar5;
  float fVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  fVar1 = this->c0;
  FVar2 = this->c1;
  auVar8 = ZEXT416((uint)fVar1);
  auVar9 = ZEXT416((uint)FVar2);
  if (fVar1 < 0.0) {
    auVar7._8_4_ = 0x80000000;
    auVar7._0_8_ = 0x8000000080000000;
    auVar7._12_4_ = 0x80000000;
    auVar7 = vxorps_avx512vl(ZEXT416((uint)FVar2),auVar7);
    auVar10._0_4_ = auVar7._0_4_ / (fVar1 + fVar1);
    auVar10._4_12_ = auVar7._4_12_;
    if ((360.0 <= auVar10._0_4_) && (auVar10._0_4_ <= 830.0)) {
      FVar3 = this->c2;
      auVar7 = vfmadd213ss_fma(auVar8,auVar10,ZEXT416((uint)FVar2));
      auVar7 = vfmadd213ss_fma(auVar7,auVar10,ZEXT416((uint)FVar3));
      if (ABS(auVar7._0_4_) == INFINITY) {
        uVar4 = vcmpss_avx512f(ZEXT816(0) << 0x20,auVar7,1);
        fVar5 = (float)((uint)((byte)uVar4 & 1) * 0x3f800000);
      }
      else {
        auVar10 = vfmadd231ss_fma(SUB6416(ZEXT464(0x3f800000),0),auVar7,auVar7);
        auVar10 = vsqrtss_avx(auVar10,auVar10);
        fVar5 = auVar7._0_4_ / (auVar10._0_4_ + auVar10._0_4_) + 0.5;
      }
      auVar8 = vfmadd213ss_fma(SUB6416(ZEXT464(0x43b40000),0),auVar8,auVar9);
      auVar8 = vfmadd213ss_fma(auVar8,SUB6416(ZEXT464(0x43b40000),0),ZEXT416((uint)FVar3));
      if (ABS(auVar8._0_4_) == INFINITY) {
        uVar4 = vcmpss_avx512f(ZEXT816(0),auVar8,1);
        fVar6 = (float)((uint)((byte)uVar4 & 1) * 0x3f800000);
      }
      else {
        auVar7 = vfmadd231ss_fma(SUB6416(ZEXT464(0x3f800000),0),auVar8,auVar8);
        auVar7 = vsqrtss_avx(auVar7,auVar7);
        fVar6 = auVar8._0_4_ / (auVar7._0_4_ + auVar7._0_4_) + 0.5;
      }
      auVar8 = vfmadd213ss_fma(ZEXT416((uint)fVar1),SUB6416(ZEXT464(0x444f8000),0),auVar9);
      auVar8 = vfmadd213ss_fma(auVar8,SUB6416(ZEXT464(0x444f8000),0),ZEXT416((uint)FVar3));
      if (ABS(auVar8._0_4_) == INFINITY) {
        uVar4 = vcmpss_avx512f(ZEXT816(0),auVar8,1);
        fVar1 = (float)((uint)((byte)uVar4 & 1) * 0x3f800000);
      }
      else {
        auVar9 = vfmadd231ss_fma(SUB6416(ZEXT464(0x3f800000),0),auVar8,auVar8);
        auVar9 = vsqrtss_avx(auVar9,auVar9);
        fVar1 = auVar8._0_4_ / (auVar9._0_4_ + auVar9._0_4_) + 0.5;
      }
      auVar8 = vmaxss_avx(ZEXT416((uint)fVar6),ZEXT416((uint)fVar5));
      auVar8 = vmaxss_avx(ZEXT416((uint)fVar1),auVar8);
      return auVar8._0_4_;
    }
  }
  auVar7 = vfmadd213ss_fma(SUB6416(ZEXT464(0x43b40000),0),ZEXT416((uint)fVar1),auVar9);
  auVar7 = vfmadd213ss_fma(auVar7,SUB6416(ZEXT464(0x43b40000),0),ZEXT416((uint)this->c2));
  if (ABS(auVar7._0_4_) == INFINITY) {
    uVar4 = vcmpss_avx512f(ZEXT816(0),auVar7,1);
    fVar1 = (float)((uint)((byte)uVar4 & 1) * 0x3f800000);
  }
  else {
    auVar10 = vfmadd231ss_fma(SUB6416(ZEXT464(0x3f800000),0),auVar7,auVar7);
    auVar10 = vsqrtss_avx(auVar10,auVar10);
    fVar1 = auVar7._0_4_ / (auVar10._0_4_ + auVar10._0_4_) + 0.5;
  }
  auVar8 = vfmadd213ss_fma(auVar8,SUB6416(ZEXT464(0x444f8000),0),auVar9);
  auVar8 = vfmadd213ss_fma(auVar8,SUB6416(ZEXT464(0x444f8000),0),ZEXT416((uint)this->c2));
  if (ABS(auVar8._0_4_) == INFINITY) {
    uVar4 = vcmpss_avx512f(ZEXT816(0),auVar8,1);
    fVar5 = (float)((uint)((byte)uVar4 & 1) * 0x3f800000);
  }
  else {
    auVar9 = vfmadd231ss_fma(SUB6416(ZEXT464(0x3f800000),0),auVar8,auVar8);
    auVar9 = vsqrtss_avx(auVar9,auVar9);
    fVar5 = auVar8._0_4_ / (auVar9._0_4_ + auVar9._0_4_) + 0.5;
  }
  auVar8 = vmaxss_avx(ZEXT416((uint)fVar5),ZEXT416((uint)fVar1));
  return auVar8._0_4_;
}

Assistant:

PBRT_CPU_GPU
    Float MaxValue() const {
        if (c0 < 0) {
            Float lambda = -c1 / (2 * c0);
            if (lambda >= 360 && lambda <= 830)
                return std::max({(*this)(lambda), (*this)(360), (*this)(830)});
        }
        return std::max((*this)(360), (*this)(830));
    }